

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O3

int __thiscall Poller::Process(Poller *this)

{
  uint uVar1;
  EventContext *pEVar2;
  epoll_event *peVar3;
  long *plVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  pEVar2 = this->context;
  uVar5 = epoll_wait(pEVar2->epollfd,(epoll_event *)pEVar2->events,pEVar2->nevents,pEVar2->timeout);
  if (0 < (int)uVar5) {
    lVar7 = 0;
    do {
      peVar3 = this->context->events;
      uVar1 = *(uint *)((long)&peVar3->events + lVar7);
      plVar4 = *(long **)((long)&peVar3->data + lVar7);
      lVar6 = 0x28;
      if ((uVar1 & 0x18) == 0) {
        if ((uVar1 & 1) != 0) {
          (**(code **)(*plVar4 + 0x18))(plVar4);
        }
        lVar6 = 0x20;
        if ((uVar1 & 4) != 0) goto LAB_00103c3e;
      }
      else {
LAB_00103c3e:
        (**(code **)(*plVar4 + lVar6))(plVar4);
      }
      lVar7 = lVar7 + 0xc;
    } while ((ulong)uVar5 * 0xc != lVar7);
  }
  return 0;
}

Assistant:

int Poller::Process() {
    int fds = epoll_wait(context->epollfd, context->events, context->nevents, context->timeout);
    for(int i = 0; i < fds; ++i) {
        auto& event = context->events[i];
        auto what = event.events;
        auto* po = (PollObj*)(event.data.ptr);
        if (what & (EPOLLHUP | EPOLLERR)) {
            po->OnError();
        }
        else {
            if(what & EPOLLIN)
                po->OnData();
            if(what & EPOLLOUT)
                po->OnWrite();
        }
    }
    return 0;
}